

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O0

int shm::close(int __fd)

{
  uint uVar1;
  undefined8 in_RAX;
  long *plVar2;
  ulong uVar3;
  int *piVar4;
  TemplateSHMException<3> *pTVar5;
  byte in_CL;
  size_t in_RDX;
  long *in_RSI;
  undefined4 in_register_0000003c;
  undefined1 in_R8B;
  float fVar6;
  double dVar7;
  float local_98;
  allocator local_91;
  string local_90 [35];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  size_t local_38;
  size_t alloc_bytes;
  long page_size;
  bool unlink_local;
  size_t sStack_20;
  bool zero_local;
  size_t nbytes_local;
  void **ptr_local;
  shm_key_t *key_local;
  
  ptr_local = (void **)CONCAT44(in_register_0000003c,__fd);
  page_size._7_1_ = in_CL & 1;
  plVar2 = (long *)(CONCAT71((int7)((ulong)in_RAX >> 8),in_R8B) & 0xffffffffffffff01);
  page_size._6_1_ = (byte)plVar2;
  sStack_20 = in_RDX;
  nbytes_local = (size_t)in_RSI;
  if (((page_size._7_1_ != 0) && (in_RSI != (long *)0x0)) && (plVar2 = in_RSI, *in_RSI != 0)) {
    plVar2 = (long *)memset((void *)*in_RSI,0,in_RDX);
  }
  if (nbytes_local != 0) {
    alloc_bytes = sysconf(0x1e);
    local_98 = (float)sStack_20;
    dVar7 = std::ceil((double)(ulong)(uint)(local_98 / (float)(long)alloc_bytes));
    fVar6 = SUB84(dVar7,0) + 1.0;
    uVar3 = (ulong)fVar6;
    local_38 = (uVar3 | (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f) * alloc_bytes;
    if (*(long *)nbytes_local != 0) {
      munmap(*(void **)nbytes_local,local_38);
    }
    *(undefined8 *)nbytes_local = 0;
    plVar2 = (long *)nbytes_local;
  }
  if ((page_size._6_1_ & 1) != 0) {
    uVar1 = shm_unlink((char *)ptr_local);
    plVar2 = (long *)(ulong)uVar1;
    if (uVar1 != 0) {
      piVar4 = __errno_location();
      if (*piVar4 == 2) {
        local_6d = 1;
        pTVar5 = (TemplateSHMException<3> *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,"Invalid file descriptor specified",&local_59);
        TemplateSHMException<3>::TemplateSHMException(pTVar5,(string *)local_58);
        local_6d = 0;
        __cxa_throw(pTVar5,&TemplateSHMException<3>::typeinfo,
                    TemplateSHMException<3>::~TemplateSHMException);
      }
      pTVar5 = (TemplateSHMException<3> *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"Undefined error, check error codes",&local_91);
      TemplateSHMException<3>::TemplateSHMException(pTVar5,(string *)local_90);
      __cxa_throw(pTVar5,&TemplateSHMException<3>::typeinfo,
                  TemplateSHMException<3>::~TemplateSHMException);
    }
  }
  return (int)CONCAT71((int7)((ulong)plVar2 >> 8),1);
}

Assistant:

bool
shm::close( const shm_key_t &key,
            void **ptr,
            const std::size_t nbytes,
            const bool zero,
            const bool unlink )
{
   if( zero && (ptr != nullptr) && ( *ptr != nullptr ) )
   {
      std::memset( *ptr, 0x0, nbytes );
   }
#if _USE_POSIX_SHM_ == 1
   if( ptr != nullptr )
   {
      /** get allocations size including extra dummy page **/
      const auto page_size( sysconf( _SC_PAGESIZE ) );
      const auto alloc_bytes( 
         static_cast< std::size_t >( 
            std::ceil(  
               static_cast< float >( nbytes ) / 
              static_cast< float >( page_size ) ) + 1 ) * page_size 
      );
      if( ( *ptr != nullptr ) && ( munmap( *ptr, alloc_bytes ) != shm::success ) )
      {
#if DEBUG   
         perror( "Failed to unmap shared memory, attempting to close!!" );
#endif
      }
      *ptr = nullptr;
   }
   if( unlink )
   {
      if( shm_unlink( key ) != 0 )
      {
#if USE_CPP_EXCEPTIONS==1      
         switch( errno )
         {
            case( ENOENT ):
            {
                throw invalid_key_exception( "Invalid file descriptor specified" );
            }
            break;
            default:
            {
                throw invalid_key_exception( "Undefined error, check error codes" );
            }
         }
#endif         
      }
   }
   //jump to return true if here. 
/** END POSIX MEMORY IMPL **/
#elif _USE_SYSTEMV_SHM_ == 1
/** START SYSTEMV IMPL **/
    /**
     * we could have gotten here b/c something failed and the 
     * user code is now calling close on an invalid shm seg. 
     * so let's stat first to be sure. 
     */
     const auto shmid = 
         shmget( key, sizeof(int), S_IRUSR | S_IWUSR );
     if( shmid == shm::failure ) 
     {
#if USE_CPP_EXCEPTIONS==1
        if( errno == ENOENT )
        {
            throw invalid_key_exception( "SHM key doesn't exist" );
        }
#else
        return( true );
#endif
     }
    /**
     * NOTE: This may not work quite perfectly b/c 
     * if there are M communicating pairs and you 
     * call this and only one happens to be detached,
     * then this may cause the segment to be deleted.
     */
    if(unlink /** only do this once **/  && shmctl(shmid, IPC_RMID, nullptr) == -1) 
    {
#if USE_CPP_EXCEPTIONS==1
       if( errno == EINVAL || errno == EIDRM )
       {
          throw invalid_key_exception( "Invalid SHM key" );
       }
       std::stringstream ss;
       ss << "Failed to set the SystemV memory region to exit on detach, non-fatal error (" 
         << std::strerror( errno ) << ")\n";
       throw bad_shm_alloc( ss.str() );
#else
       return( false );
#endif
    }
     //else we're here, and it exists
     if( shmdt( *ptr ) == shm::failure ) 
     {
#if USE_CPP_EXCEPTIONS==1
        std::stringstream ss;
        ss << "Failed to detach SHM with error code (" 
            <<  std::strerror( errno ) << ").";
        throw invalid_key_exception( ss.str() );
#else
        return( false );
#endif
     }

/** END SYSTEMV IMPL **/
#endif
    return( true );
}